

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O0

bool __thiscall blc::tools::pipe::push_out(pipe *this,string *target,string *str,mutex *locker)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long *in_RDI;
  uint i;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar5;
  uint local_2c;
  bool local_1;
  
  if ((in_RSI == 0) || (in_RCX == 0)) {
    local_1 = false;
  }
  else {
    uVar2 = (**(code **)(*in_RDI + 0x30))();
    if ((uVar2 & 1) == 0) {
      if ((*(byte *)((long)in_RDI + 0x29) & 1) == 0) {
        bVar1 = std::mutex::try_lock
                          ((mutex *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
        if (!bVar1) {
          return false;
        }
      }
      else {
        std::mutex::lock((mutex *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      }
      std::__cxx11::string::clear();
      local_2c = 0;
      while ((uVar2 = std::__cxx11::string::size(), local_2c < uVar2 &&
             (pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar3 != '\n'))) {
        std::__cxx11::string::size();
        std::__cxx11::string::resize(in_RDX);
        puVar4 = (undefined1 *)std::__cxx11::string::operator[](in_RSI);
        uVar5 = *puVar4;
        puVar4 = (undefined1 *)std::__cxx11::string::operator[](in_RDX);
        *puVar4 = uVar5;
        local_2c = local_2c + 1;
      }
      std::__cxx11::string::erase(in_RSI,0);
      std::mutex::unlock((mutex *)0x11ba64);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool blc::tools::pipe::push_out(std::string *target, std::string *str, std::mutex *locker) const {
	unsigned int i;

	if (target == nullptr || locker == nullptr)
		return (false);
	if (this->isClosed())
		return (false);
	if (this->_block == false) {
		if (locker->try_lock() == false)
			return (false);
	} else {
		locker->lock();
	}
	(*str).clear();
	for (i = 0; target->size() > i; i++) {
		if ((*target)[i] == '\n')
			break;
		(*str).resize((*str).size() + 1);
		(*str)[i] = (*target)[i];
	}
	target->erase(0, i + 1);
	locker->unlock();
	return (true);
}